

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::importdescriptors(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffdf78;
  allocator<RPCArg> *paVar2;
  allocator<RPCResult> *paVar3;
  UniValue *in_stack_ffffffffffffdf80;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffdf88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdf90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdfa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdfb0;
  UniValue *in_stack_ffffffffffffdfb8;
  UniValue *in_stack_ffffffffffffdfc0;
  undefined7 in_stack_ffffffffffffdfc8;
  undefined1 in_stack_ffffffffffffdfcf;
  string *in_stack_ffffffffffffdfd0;
  undefined7 in_stack_ffffffffffffdfd8;
  undefined1 in_stack_ffffffffffffdfdf;
  undefined4 in_stack_ffffffffffffdfe0;
  Type in_stack_ffffffffffffdfe4;
  string *in_stack_ffffffffffffdfe8;
  undefined4 in_stack_ffffffffffffdff0;
  Type in_stack_ffffffffffffdff4;
  undefined4 in_stack_ffffffffffffdff8;
  Type in_stack_ffffffffffffdffc;
  RPCArg *pRVar4;
  RPCArgOptions *in_stack_ffffffffffffe020;
  RPCExamples *in_stack_ffffffffffffe0c0;
  RPCResults *in_stack_ffffffffffffe0c8;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe0d0;
  string *in_stack_ffffffffffffe0d8;
  undefined1 *puVar5;
  string *in_stack_ffffffffffffe0e0;
  RPCHelpMan *in_stack_ffffffffffffe0e8;
  undefined1 *local_1f08;
  undefined1 *local_1ef0;
  undefined1 *local_1ed8;
  undefined1 *local_1ec0;
  undefined1 *local_1ea8;
  undefined1 *local_1e90;
  undefined1 *local_1e78;
  RPCMethodImpl *fun;
  undefined1 local_1b60 [34];
  allocator<char> local_1b3e;
  allocator<char> local_1b3d;
  allocator<char> local_1b3c [4];
  pointer local_1b38;
  pointer pRStack_1b30;
  pointer local_1b28;
  allocator<char> local_1b1a;
  undefined1 local_1b19 [31];
  allocator<char> local_1afa [32];
  allocator<char> local_1ada;
  allocator<char> local_1ad9 [31];
  allocator<char> local_1aba;
  allocator<char> local_1ab9;
  size_type local_1ab8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1ab0;
  allocator<char> local_1a92;
  allocator<char> local_1a91 [31];
  allocator<char> local_1a72;
  allocator<char> local_1a71 [31];
  allocator<char> local_1a52;
  allocator<char> local_1a51 [26];
  allocator<char> local_1a37 [3];
  allocator<char> local_1a34;
  allocator<char> local_1a33;
  allocator<char> local_1a32;
  undefined1 local_1a31;
  allocator<char> local_1a30 [2];
  allocator<char> local_1a2e;
  allocator<char> local_1a2d;
  undefined4 local_1a2c;
  allocator<char> local_1a26;
  allocator<char> local_1a25;
  undefined4 local_1a24;
  allocator<char> local_1a1e;
  allocator<char> local_1a1d;
  undefined4 local_1a1c;
  allocator<char> local_1a15;
  allocator<char> local_1a14;
  undefined1 local_1a13;
  allocator<char> local_1a12;
  allocator<char> local_1a11;
  undefined4 local_1a10;
  allocator<char> local_1a09 [32];
  allocator<char> local_19e9;
  undefined4 local_19e8;
  allocator<char> local_19e1 [32];
  allocator<char> local_19c1;
  undefined4 local_19c0;
  allocator<char> local_19b9 [31];
  allocator<char> local_199a;
  allocator<char> local_1999 [321];
  undefined1 local_1858 [136];
  undefined1 local_17d0 [128];
  undefined1 local_1750 [136];
  undefined1 local_16c8 [128];
  undefined1 local_1648 [408];
  undefined1 local_14b0 [64];
  undefined1 local_1470 [136];
  undefined1 local_13e8 [200];
  allocator<RPCArg> local_1320 [40];
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined8 local_12e8;
  undefined1 local_12e0;
  undefined1 local_12df;
  allocator<RPCArg> local_12d8 [40];
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined1 local_1298;
  undefined1 local_1297;
  undefined1 local_1290;
  undefined8 local_1268;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined1 local_1250;
  undefined1 local_124f;
  undefined1 local_1150;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined1 local_1110;
  undefined1 local_110f;
  undefined1 local_1010 [16];
  undefined8 local_1000;
  undefined1 local_fd0 [64];
  undefined1 local_f90;
  undefined1 local_f8f;
  undefined1 local_ec8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined1 local_e88;
  undefined1 local_e87;
  undefined1 local_de0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined1 local_da0;
  undefined1 local_d9f;
  undefined1 local_cf8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined1 local_cb8;
  undefined1 local_cb7;
  undefined1 local_bb8;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined1 local_b78;
  undefined1 local_b77;
  undefined1 local_ad0 [1848];
  undefined1 local_398 [160];
  undefined1 local_2f8 [264];
  undefined1 local_1f0 [160];
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  pRVar4 = (RPCArg *)0x0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_19c0 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,&in_stack_ffffffffffffdf80->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_19e8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,&in_stack_ffffffffffffdf80->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1a10 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,&in_stack_ffffffffffffdf80->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_bb8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  local_b90 = 0;
  uStack_b88 = 0;
  local_b80 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdf78);
  local_b78 = 0;
  local_b77 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
                 in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffdfd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1a13 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdfb8,(bool *)in_stack_ffffffffffffdfb0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,in_stack_ffffffffffffdf80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_cf8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  local_cd0 = 0;
  uStack_cc8 = 0;
  local_cc0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdf78);
  local_cb8 = 0;
  local_cb7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
                 in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffdfd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1a1c = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,&in_stack_ffffffffffffdf80->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_de0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  local_db8 = 0;
  uStack_db0 = 0;
  local_da8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdf78);
  local_da0 = 0;
  local_d9f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
                 in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffdfd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1a24 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,&in_stack_ffffffffffffdf80->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_ec8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  local_ea0 = 0;
  uStack_e98 = 0;
  local_e90 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdf78);
  local_e88 = 0;
  local_e87 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
                 in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffdfd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1a2c = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,&in_stack_ffffffffffffdf80->typ);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffdfc0);
  std::operator+(in_stack_ffffffffffffdf90,(char *)in_stack_ffffffffffffdf88);
  local_fd0[0] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffdf78);
  __l._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdfb8,__l,(allocator_type *)in_stack_ffffffffffffdfb0);
  local_f90 = 0;
  local_f8f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
                 in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffdfd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1a31 = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdfb8,(bool *)in_stack_ffffffffffffdfb0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,in_stack_ffffffffffffdf80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1150 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  local_1128 = 0;
  uStack_1120 = 0;
  local_1118 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdf78);
  local_1110 = 0;
  local_110f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
                 in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffdfd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>
            (in_stack_ffffffffffffdfc0,(char (*) [1])in_stack_ffffffffffffdfb8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdf88,in_stack_ffffffffffffdf80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1290 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  local_1268 = 0;
  uStack_1260 = 0;
  local_1258 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdf78);
  local_1250 = 0;
  local_124f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
                 in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffdfd0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffdf78);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdfb8,__l_00,
             (allocator_type *)in_stack_ffffffffffffdfb0);
  local_12d8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffdf90);
  local_12b0 = 0;
  uStack_12a8 = 0;
  local_12a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdf78);
  local_1298 = 0;
  local_1297 = 0;
  paVar2 = local_12d8;
  RPCArg::RPCArg(pRVar4,(string *)CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8),
                 in_stack_ffffffffffffdff4,(Fallback *)in_stack_ffffffffffffdfe8,
                 (string *)CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffe020);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l_01._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdfb8,__l_01,
             (allocator_type *)in_stack_ffffffffffffdfb0);
  local_1320[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_12f8 = 0;
  uStack_12f0 = 0;
  local_12e8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_12e0 = 0;
  local_12df = 0;
  paVar2 = local_1320;
  RPCArg::RPCArg(pRVar4,(string *)CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8),
                 in_stack_ffffffffffffdff4,(Fallback *)in_stack_ffffffffffffdfe8,
                 (string *)CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
                 in_stack_ffffffffffffe020);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l_02._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdfb8,__l_02,
             (allocator_type *)in_stack_ffffffffffffdfb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1ab8 = 0;
  aStack_1ab0._M_allocated_capacity = 0;
  aStack_1ab0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)pRVar4,in_stack_ffffffffffffdffc,
             (string *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
             in_stack_ffffffffffffdfe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
             (bool)in_stack_ffffffffffffdfdf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1afa[2] = (allocator<char>)0x0;
  local_1afa[3] = (allocator<char>)0x0;
  local_1afa[4] = (allocator<char>)0x0;
  local_1afa[5] = (allocator<char>)0x0;
  local_1afa[6] = (allocator<char>)0x0;
  local_1afa[7] = (allocator<char>)0x0;
  local_1afa[8] = (allocator<char>)0x0;
  local_1afa[9] = (allocator<char>)0x0;
  local_1afa[10] = (allocator<char>)0x0;
  local_1afa[0xb] = (allocator<char>)0x0;
  local_1afa[0xc] = (allocator<char>)0x0;
  local_1afa[0xd] = (allocator<char>)0x0;
  local_1afa[0xe] = (allocator<char>)0x0;
  local_1afa[0xf] = (allocator<char>)0x0;
  local_1afa[0x10] = (allocator<char>)0x0;
  local_1afa[0x11] = (allocator<char>)0x0;
  local_1afa[0x12] = (allocator<char>)0x0;
  local_1afa[0x13] = (allocator<char>)0x0;
  local_1afa[0x14] = (allocator<char>)0x0;
  local_1afa[0x15] = (allocator<char>)0x0;
  local_1afa[0x16] = (allocator<char>)0x0;
  local_1afa[0x17] = (allocator<char>)0x0;
  local_1afa[0x18] = (allocator<char>)0x0;
  local_1afa[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)pRVar4,in_stack_ffffffffffffdffc,
             (string *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
             in_stack_ffffffffffffdfe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
             (bool)in_stack_ffffffffffffdfdf);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l_03._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdfb8,__l_03,
             (allocator_type *)in_stack_ffffffffffffdfb0);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8),
             in_stack_ffffffffffffdff4,in_stack_ffffffffffffdfe8,
             SUB41(in_stack_ffffffffffffdfe4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdfd0,
             (bool)in_stack_ffffffffffffdfcf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  fun = (RPCMethodImpl *)local_1b19;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  local_1b38 = (pointer)0x0;
  pRStack_1b30 = (pointer)0x0;
  local_1b28 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            ((RPCResult *)pRVar4,in_stack_ffffffffffffdffc,
             (string *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
             in_stack_ffffffffffffdfe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
             (bool)in_stack_ffffffffffffdfdf);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l_04._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdfb8,__l_04,
             (allocator_type *)in_stack_ffffffffffffdfb0);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8),
             in_stack_ffffffffffffdff4,in_stack_ffffffffffffdfe8,
             SUB41(in_stack_ffffffffffffdfe4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffdfdf,in_stack_ffffffffffffdfd8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdfd0,
             (bool)in_stack_ffffffffffffdfcf);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l_05._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdfb8,__l_05,
             (allocator_type *)in_stack_ffffffffffffdfb0);
  RPCResult::RPCResult
            ((RPCResult *)pRVar4,in_stack_ffffffffffffdffc,
             (string *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
             in_stack_ffffffffffffdfe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
             (bool)in_stack_ffffffffffffdfdf);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffdfc8;
  __l_06._M_array = (iterator)in_stack_ffffffffffffdfc0;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffdfcf;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdfb8,__l_06,
             (allocator_type *)in_stack_ffffffffffffdfb0);
  RPCResult::RPCResult
            ((RPCResult *)pRVar4,in_stack_ffffffffffffdffc,
             (string *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0),
             in_stack_ffffffffffffdfe8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0),
             (bool)in_stack_ffffffffffffdfdf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffdffc,in_stack_ffffffffffffdff8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  HelpExampleCli(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffdfcf,in_stack_ffffffffffffdfc8),
             (char *)in_stack_ffffffffffffdfc0,(allocator<char> *)in_stack_ffffffffffffdfb8);
  HelpExampleCli(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
  std::operator+(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0xc12b74);
  pRVar4 = (RPCArg *)local_1b60;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::importdescriptors()::__0,void>
            (in_stack_ffffffffffffdf88,(anon_class_1_0_00000001 *)in_stack_ffffffffffffdf80);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe0e8,in_stack_ffffffffffffe0e0,in_stack_ffffffffffffe0d8,
             in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)pRVar4);
  RPCExamples::~RPCExamples((RPCExamples *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1b60 + 0x21));
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1b3e);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1b3d);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1b3c);
  RPCResults::~RPCResults((RPCResults *)pRVar4);
  RPCResult::~RPCResult((RPCResult *)pRVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)pRVar4);
  local_1e78 = local_13e8;
  do {
    local_1e78 = local_1e78 + -0x88;
    RPCResult::~RPCResult((RPCResult *)pRVar4);
  } while (local_1e78 != local_1470);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)pRVar4);
  local_1e90 = local_14b0;
  do {
    local_1e90 = local_1e90 + -0x88;
    RPCResult::~RPCResult((RPCResult *)pRVar4);
  } while (local_1e90 != local_1648);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)pRVar4);
  local_1ea8 = local_17d0;
  do {
    local_1ea8 = local_1ea8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)pRVar4);
  } while (local_1ea8 != local_1858);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf88);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1b1a);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1b19);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1b19 + 0x1e));
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1afa);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf88);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)pRVar4);
  local_1ec0 = local_16c8;
  do {
    local_1ec0 = local_1ec0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)pRVar4);
  } while (local_1ec0 != local_1750);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf88);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1ada);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1ad9);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1aba);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1ab9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdf88);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a92);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1a91);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a72);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1a71);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a52);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1a51);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdf88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)pRVar4);
  local_1ed8 = local_48;
  do {
    local_1ed8 = local_1ed8 + -0x108;
    RPCArg::~RPCArg(pRVar4);
  } while (local_1ed8 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::allocator<char>::~allocator(local_1a37);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdf88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)pRVar4);
  local_1ef0 = local_1f0;
  do {
    local_1ef0 = local_1ef0 + -0x108;
    RPCArg::~RPCArg(pRVar4);
  } while (local_1ef0 != local_2f8);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdf88);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)pRVar4);
  local_1f08 = local_398;
  do {
    local_1f08 = local_1f08 + -0x108;
    RPCArg::~RPCArg(pRVar4);
  } while (local_1f08 != local_ad0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a34);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  UniValue::~UniValue((UniValue *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a33);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a32);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  UniValue::~UniValue((UniValue *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1a30);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)pRVar4);
  puVar5 = local_1010;
  puVar1 = local_fd0;
  do {
    puVar1 = puVar1 + -0x20;
    std::__cxx11::string::~string(&pRVar4->m_names);
  } while (puVar1 != puVar5);
  std::allocator<char>::~allocator(&local_1a2e);
  std::allocator<char>::~allocator(&local_1a2d);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a26);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a25);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a1e);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a1d);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a15);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a14);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  UniValue::~UniValue((UniValue *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a12);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_1a11);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1a09);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_19e9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_19e1);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_19c1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)pRVar4);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_19b9);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(&local_199a);
  std::__cxx11::string::~string(&pRVar4->m_names);
  std::allocator<char>::~allocator(local_1999);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan importdescriptors()
{
    return RPCHelpMan{"importdescriptors",
                "\nImport descriptors. This will trigger a rescan of the blockchain based on the earliest timestamp of all descriptors being imported. Requires a new wallet backup.\n"
            "When importing descriptors with multipath key expressions, if the multipath specifier contains exactly two elements, the descriptor produced from the second elements will be imported as an internal descriptor.\n"
            "\nNote: This call can take over an hour to complete if using an early timestamp; during that time, other rpc calls\n"
            "may report that the imported keys, addresses or scripts exist but related transactions are still missing.\n"
            "The rescan is significantly faster if block filters are available (using startup option \"-blockfilterindex=1\").\n",
                {
                    {"requests", RPCArg::Type::ARR, RPCArg::Optional::NO, "Data to be imported",
                        {
                            {"", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "",
                                {
                                    {"desc", RPCArg::Type::STR, RPCArg::Optional::NO, "Descriptor to import."},
                                    {"active", RPCArg::Type::BOOL, RPCArg::Default{false}, "Set this descriptor to be the active descriptor for the corresponding output type/externality"},
                                    {"range", RPCArg::Type::RANGE, RPCArg::Optional::OMITTED, "If a ranged descriptor is used, this specifies the end or the range (in the form [begin,end]) to import"},
                                    {"next_index", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "If a ranged descriptor is set to active, this specifies the next index to generate addresses from"},
                                    {"timestamp", RPCArg::Type::NUM, RPCArg::Optional::NO, "Time from which to start rescanning the blockchain for this descriptor, in " + UNIX_EPOCH_TIME + "\n"
                                        "Use the string \"now\" to substitute the current synced blockchain time.\n"
                                        "\"now\" can be specified to bypass scanning, for outputs which are known to never have been used, and\n"
                                        "0 can be specified to scan the entire blockchain. Blocks up to 2 hours before the earliest timestamp\n"
                                        "of all descriptors being imported will be scanned as well as the mempool.",
                                        RPCArgOptions{.type_str={"timestamp | \"now\"", "integer / string"}}
                                    },
                                    {"internal", RPCArg::Type::BOOL, RPCArg::Default{false}, "Whether matching outputs should be treated as not incoming payments (e.g. change)"},
                                    {"label", RPCArg::Type::STR, RPCArg::Default{""}, "Label to assign to the address, only allowed with internal=false. Disabled for ranged descriptors"},
                                },
                            },
                        },
                        RPCArgOptions{.oneline_description="requests"}},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "Response is an array with the same size as the input that has the execution result",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::BOOL, "success", ""},
                            {RPCResult::Type::ARR, "warnings", /*optional=*/true, "",
                            {
                                {RPCResult::Type::STR, "", ""},
                            }},
                            {RPCResult::Type::OBJ, "error", /*optional=*/true, "",
                            {
                                {RPCResult::Type::ELISION, "", "JSONRPC error"},
                            }},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("importdescriptors", "'[{ \"desc\": \"<my descriptor>\", \"timestamp\":1455191478, \"internal\": true }, "
                                          "{ \"desc\": \"<my descriptor 2>\", \"label\": \"example 2\", \"timestamp\": 1455191480 }]'") +
                    HelpExampleCli("importdescriptors", "'[{ \"desc\": \"<my descriptor>\", \"timestamp\":1455191478, \"active\": true, \"range\": [0,100], \"label\": \"<my bech32 wallet>\" }]'")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& main_request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(main_request);
    if (!pwallet) return UniValue::VNULL;
    CWallet& wallet{*pwallet};

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    wallet.BlockUntilSyncedToCurrentChain();

    //  Make sure wallet is a descriptor wallet
    if (!pwallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "importdescriptors is not available for non-descriptor wallets");
    }

    WalletRescanReserver reserver(*pwallet);
    if (!reserver.reserve(/*with_passphrase=*/true)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
    }

    // Ensure that the wallet is not locked for the remainder of this RPC, as
    // the passphrase is used to top up the keypool.
    LOCK(pwallet->m_relock_mutex);

    const UniValue& requests = main_request.params[0];
    const int64_t minimum_timestamp = 1;
    int64_t now = 0;
    int64_t lowest_timestamp = 0;
    bool rescan = false;
    UniValue response(UniValue::VARR);
    {
        LOCK(pwallet->cs_wallet);
        EnsureWalletIsUnlocked(*pwallet);

        CHECK_NONFATAL(pwallet->chain().findBlock(pwallet->GetLastBlockHash(), FoundBlock().time(lowest_timestamp).mtpTime(now)));

        // Get all timestamps and extract the lowest timestamp
        for (const UniValue& request : requests.getValues()) {
            // This throws an error if "timestamp" doesn't exist
            const int64_t timestamp = std::max(GetImportTimestamp(request, now), minimum_timestamp);
            const UniValue result = ProcessDescriptorImport(*pwallet, request, timestamp);
            response.push_back(result);

            if (lowest_timestamp > timestamp ) {
                lowest_timestamp = timestamp;
            }

            // If we know the chain tip, and at least one request was successful then allow rescan
            if (!rescan && result["success"].get_bool()) {
                rescan = true;
            }
        }
        pwallet->ConnectScriptPubKeyManNotifiers();
    }

    // Rescan the blockchain using the lowest timestamp
    if (rescan) {
        int64_t scanned_time = pwallet->RescanFromTime(lowest_timestamp, reserver, /*update=*/true);
        pwallet->ResubmitWalletTransactions(/*relay=*/false, /*force=*/true);

        if (pwallet->IsAbortingRescan()) {
            throw JSONRPCError(RPC_MISC_ERROR, "Rescan aborted by user.");
        }

        if (scanned_time > lowest_timestamp) {
            std::vector<UniValue> results = response.getValues();
            response.clear();
            response.setArray();

            // Compose the response
            for (unsigned int i = 0; i < requests.size(); ++i) {
                const UniValue& request = requests.getValues().at(i);

                // If the descriptor timestamp is within the successfully scanned
                // range, or if the import result already has an error set, let
                // the result stand unmodified. Otherwise replace the result
                // with an error message.
                if (scanned_time <= GetImportTimestamp(request, now) || results.at(i).exists("error")) {
                    response.push_back(results.at(i));
                } else {
                    UniValue result = UniValue(UniValue::VOBJ);
                    result.pushKV("success", UniValue(false));
                    result.pushKV(
                        "error",
                        JSONRPCError(
                            RPC_MISC_ERROR,
                            strprintf("Rescan failed for descriptor with timestamp %d. There was an error reading a "
                                      "block from time %d, which is after or within %d seconds of key creation, and "
                                      "could contain transactions pertaining to the desc. As a result, transactions "
                                      "and coins using this desc may not appear in the wallet. This error could be "
                                      "caused by pruning or data corruption (see bitcoind log for details) and could "
                                      "be dealt with by downloading and rescanning the relevant blocks (see -reindex "
                                      "option and rescanblockchain RPC).",
                                GetImportTimestamp(request, now), scanned_time - TIMESTAMP_WINDOW - 1, TIMESTAMP_WINDOW)));
                    response.push_back(std::move(result));
                }
            }
        }
    }

    return response;
},
    };
}